

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaL_argerror(lua_State *L,int narg,char *extramsg)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  uVar3 = (ulong)(uint)narg;
  uVar2 = (long)L->ci - (long)L->base_ci;
  if (L->ci < L->base_ci || uVar2 == 0) {
    luaL_error(L,"bad argument #%d (%s)",uVar3,extramsg);
  }
  lStack_98.i_ci = (int)(uVar2 >> 3) * -0x33333333;
  lua_getinfo(L,"n",&lStack_98);
  iVar1 = strcmp(lStack_98.namewhat,"method");
  if ((iVar1 == 0) && (uVar3 = (ulong)(narg - 1U), narg - 1U == 0)) {
    luaL_error(L,"calling \'%s\' on bad self (%s)",lStack_98.name,extramsg);
  }
  if (lStack_98.name == (char *)0x0) {
    lStack_98.name = "?";
  }
  luaL_error(L,"bad argument #%d to \'%s\' (%s)",uVar3,lStack_98.name,extramsg);
}

Assistant:

static int luaL_argerror(lua_State*L,int narg,const char*extramsg){
lua_Debug ar;
if(!lua_getstack(L,0,&ar))
return luaL_error(L,"bad argument #%d (%s)",narg,extramsg);
lua_getinfo(L,"n",&ar);
if(strcmp(ar.namewhat,"method")==0){
narg--;
if(narg==0)
return luaL_error(L,"calling "LUA_QL("%s")" on bad self (%s)",
ar.name,extramsg);
}
if(ar.name==NULL)
ar.name="?";
return luaL_error(L,"bad argument #%d to "LUA_QL("%s")" (%s)",
narg,ar.name,extramsg);
}